

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O0

uint32_t spvtools::val::anon_unknown_0::GetPlaneCoordSize(ImageTypeInfo *info)

{
  Dim DVar1;
  uint32_t local_14;
  uint32_t plane_size;
  ImageTypeInfo *info_local;
  
  DVar1 = info->dim;
  if (DVar1 == Dim1D) {
LAB_0020c300:
    local_14 = 1;
  }
  else {
    if (DVar1 != Dim2D) {
      if (DVar1 - Dim3D < 2) {
        return 3;
      }
      if (DVar1 != DimRect) {
        if (DVar1 == Buffer) goto LAB_0020c300;
        if ((DVar1 != DimSubpassData) && (DVar1 != DimTileImageDataEXT)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_image.cpp"
                        ,0xdf,
                        "uint32_t spvtools::val::(anonymous namespace)::GetPlaneCoordSize(const ImageTypeInfo &)"
                       );
        }
      }
    }
    local_14 = 2;
  }
  return local_14;
}

Assistant:

uint32_t GetPlaneCoordSize(const ImageTypeInfo& info) {
  uint32_t plane_size = 0;
  // If this switch breaks your build, please add new values below.
  switch (info.dim) {
    case spv::Dim::Dim1D:
    case spv::Dim::Buffer:
      plane_size = 1;
      break;
    case spv::Dim::Dim2D:
    case spv::Dim::Rect:
    case spv::Dim::SubpassData:
    case spv::Dim::TileImageDataEXT:
      plane_size = 2;
      break;
    case spv::Dim::Dim3D:
    case spv::Dim::Cube:
      // For Cube direction vector is used instead of UV.
      plane_size = 3;
      break;
    case spv::Dim::Max:
    default:
      assert(0);
      break;
  }

  return plane_size;
}